

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

int __thiscall qpdf::BaseHandle::copy(BaseHandle *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  QPDFObjGen og;
  size_t this_00;
  bool bVar2;
  qpdf_object_type_e qVar3;
  QPDF_Bool *args;
  QPDF_Integer *args_00;
  pointer pSVar4;
  mapped_type *this_01;
  size_type __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  mapped_type *this_03;
  runtime_error *this_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  logic_error *plVar6;
  element_type *peVar7;
  QPDFObjectHandle local_1b8;
  byte local_1a1;
  BaseHandle local_1a0;
  QPDFObjectHandle local_190;
  EVP_PKEY_CTX *local_180;
  type *val;
  type *key;
  _Self local_168;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  new_items;
  QPDF_Dictionary *d;
  BaseHandle local_110;
  QPDFObjectHandle local_100;
  EVP_PKEY_CTX *local_f0;
  QPDFObjectHandle *element;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range4_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> result_1;
  BaseHandle local_b0;
  QPDFObjectHandle local_a0;
  EVP_PKEY_CTX *local_90;
  type *oh;
  type *idx;
  _Self local_78;
  iterator __end4;
  iterator __begin4;
  map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
  *__range4;
  undefined1 local_58 [8];
  QPDF_Array result;
  QPDF_Array *a;
  bool shallow_local;
  BaseHandle *this_local;
  
  qVar3 = resolved_type_code((BaseHandle *)dst);
  switch(qVar3) {
  case ot_uninitialized:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar6,"QPDFObjectHandle: attempting to copy an uninitialized object");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_reserved:
    QPDFObject::create<QPDF_Reserved>();
    break;
  case ot_null:
    QPDFObject::create<QPDF_Null>();
    break;
  case ot_boolean:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    args = std::
           get<QPDF_Bool,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                     (&peVar7->value);
    QPDFObject::create<QPDF_Bool,bool&>((QPDFObject *)this,&args->val);
    break;
  case ot_integer:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    args_00 = std::
              get<QPDF_Integer,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value);
    QPDFObject::create<QPDF_Integer,long_long&>((QPDFObject *)this,&args_00->val);
    break;
  case ot_real:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    pbVar5 = &std::
              get<QPDF_Real,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value)->val;
    QPDFObject::create<QPDF_Real,std::__cxx11::string&>((QPDFObject *)this,pbVar5);
    break;
  case ot_string:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    pbVar5 = &std::
              get<QPDF_String,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value)->val;
    QPDFObject::create<QPDF_String,std::__cxx11::string&>((QPDFObject *)this,pbVar5);
    break;
  case ot_name:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    pbVar5 = &std::
              get<QPDF_Name,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value)->name;
    QPDFObject::create<QPDF_Name,std::__cxx11::string&>((QPDFObject *)this,pbVar5);
    break;
  case ot_array:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    result.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  get<QPDF_Array,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                            (&peVar7->value);
    if (((ulong)src & 1) == 0) {
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)
                         result.elements.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      QTC::TC("qpdf","QPDF_Array copy",(uint)!bVar2);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)
                         result.elements.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        QPDF_Array::QPDF_Array((QPDF_Array *)local_58);
        std::make_unique<QPDF_Array::Sparse>();
        std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::operator=
                  ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                   local_58,(unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                             *)&__range4);
        std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
                  ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                   &__range4);
        pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                             *)result.elements.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar1 = pSVar4->size;
        pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                             *)local_58);
        pSVar4->size = iVar1;
        pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                 operator->((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                             *)result.elements.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __end4 = std::
                 map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                 ::begin(&pSVar4->elements);
        local_78._M_node =
             (_Base_ptr)
             std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::end(&pSVar4->elements);
        while (bVar2 = std::operator!=(&__end4,&local_78), bVar2) {
          idx = &std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator*(&__end4)
                 ->first;
          oh = (type *)std::get<0ul,int_const,QPDFObjectHandle>
                                 ((pair<const_int,_QPDFObjectHandle> *)idx);
          local_90 = (EVP_PKEY_CTX *)
                     std::get<1ul,int_const,QPDFObjectHandle>
                               ((pair<const_int,_QPDFObjectHandle> *)idx);
          result_1.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          bVar2 = indirect((BaseHandle *)local_90);
          if (bVar2) {
            QPDFObjectHandle::QPDFObjectHandle(&local_a0,(QPDFObjectHandle *)local_90);
          }
          else {
            copy(&local_b0,local_90,(EVP_PKEY_CTX *)0x0);
            result_1.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            QPDFObjectHandle::QPDFObjectHandle(&local_a0,&local_b0.obj);
          }
          pSVar4 = std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::
                   operator->((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                               *)local_58);
          this_01 = std::
                    map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                    ::operator[](&pSVar4->elements,(key_type *)oh);
          QPDFObjectHandle::operator=(this_01,&local_a0);
          QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
          if ((result_1.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            std::shared_ptr<QPDFObject>::~shared_ptr(&local_b0.obj);
          }
          std::_Rb_tree_iterator<std::pair<const_int,_QPDFObjectHandle>_>::operator++(&__end4);
        }
        QPDFObject::create<QPDF_Array,QPDF_Array>((QPDFObject *)this,(QPDF_Array *)local_58);
        QPDF_Array::~QPDF_Array((QPDF_Array *)local_58);
      }
      else {
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4_1);
        __n = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                         &((result.elements.
                            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).
                          obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        );
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4_1,__n);
        this_02 = &((result.elements.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage)->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        __end4_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                             ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_02
                             );
        element = (QPDFObjectHandle *)
                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_02)
        ;
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                   *)&element), bVar2) {
          local_f0 = (EVP_PKEY_CTX *)
                     __gnu_cxx::
                     __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                     ::operator*(&__end4_1);
          d._7_1_ = 0;
          bVar2 = operator_cast_to_bool((BaseHandle *)local_f0);
          if (bVar2) {
            bVar2 = indirect((BaseHandle *)local_f0);
            if (bVar2) {
              QPDFObjectHandle::QPDFObjectHandle(&local_100,(QPDFObjectHandle *)local_f0);
            }
            else {
              copy(&local_110,local_f0,(EVP_PKEY_CTX *)0x0);
              d._7_1_ = 1;
              QPDFObjectHandle::QPDFObjectHandle(&local_100,&local_110.obj);
            }
          }
          else {
            QPDFObjectHandle::QPDFObjectHandle(&local_100,(QPDFObjectHandle *)local_f0);
          }
          std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
          emplace_back<QPDFObjectHandle_const>
                    ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&__range4_1,
                     &local_100);
          QPDFObjectHandle::~QPDFObjectHandle(&local_100);
          if ((d._7_1_ & 1) != 0) {
            std::shared_ptr<QPDFObject>::~shared_ptr(&local_110.obj);
          }
          __gnu_cxx::
          __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end4_1);
        }
        d._6_1_ = 0;
        QPDFObject::
        create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                  ((QPDFObject *)this,
                   (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4_1,
                   (bool *)((long)&d + 6));
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range4_1);
      }
    }
    else {
      QPDFObject::create<QPDF_Array,QPDF_Array_const&>
                ((QPDFObject *)this,
                 (QPDF_Array *)
                 result.elements.
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    }
    break;
  case ot_dictionary:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    new_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 get<QPDF_Dictionary,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                           (&peVar7->value);
    if (((ulong)src & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             *)&__range3);
      this_00 = new_items._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                        *)new_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_168._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)this_00);
      while (bVar2 = std::operator!=(&__end3,&local_168), bVar2) {
        key = &std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end3)->first;
        val = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
        local_180 = (EVP_PKEY_CTX *)
                    std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                *)key);
        local_1a1 = 0;
        bVar2 = indirect((BaseHandle *)local_180);
        if (bVar2) {
          QPDFObjectHandle::QPDFObjectHandle(&local_190,(QPDFObjectHandle *)local_180);
        }
        else {
          copy(&local_1a0,local_180,(EVP_PKEY_CTX *)0x0);
          local_1a1 = 1;
          QPDFObjectHandle::QPDFObjectHandle(&local_190,&local_1a0.obj);
        }
        this_03 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                                *)&__range3,(key_type *)val);
        QPDFObjectHandle::operator=(this_03,&local_190);
        QPDFObjectHandle::~QPDFObjectHandle(&local_190);
        if ((local_1a1 & 1) != 0) {
          std::shared_ptr<QPDFObject>::~shared_ptr(&local_1a0.obj);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
        ::operator++(&__end3);
      }
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>&>
                ((QPDFObject *)this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)&__range3);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              *)&__range3);
    }
    else {
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>const&>
                ((QPDFObject *)this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)new_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    break;
  case ot_stream:
    QTC::TC("qpdf","QPDF_Stream ERR shallow copy stream",0);
    this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_04,"stream objects cannot be cloned");
    __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ot_operator:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    pbVar5 = &std::
              get<QPDF_Operator,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value)->val;
    QPDFObject::create<QPDF_Operator,std::__cxx11::string&>((QPDFObject *)this,pbVar5);
    break;
  case ot_inlineimage:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    pbVar5 = &std::
              get<QPDF_InlineImage,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&peVar7->value)->val;
    QPDFObject::create<QPDF_InlineImage,std::__cxx11::string&>((QPDFObject *)this,pbVar5);
    break;
  case ot_unresolved:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar6,"QPDFObjectHandle: attempting to unparse a reserved object");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_destroyed:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar6,"attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_reference:
    peVar7 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )dst);
    og = (QPDFObjGen)peVar7->qpdf;
    std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)dst);
    QPDF::getObject((QPDF *)&local_1b8,og);
    QPDFObjectHandle::getObj((QPDFObjectHandle *)this);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
    break;
  default:
    std::shared_ptr<QPDFObject>::shared_ptr(&this->obj);
  }
  return (int)this;
}

Assistant:

std::shared_ptr<QPDFObject>
BaseHandle::copy(bool shallow) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error("QPDFObjectHandle: attempting to copy an uninitialized object");
        return {}; // does not return
    case ::ot_reserved:
        return QPDFObject::create<QPDF_Reserved>();
    case ::ot_null:
        return QPDFObject::create<QPDF_Null>();
    case ::ot_boolean:
        return QPDFObject::create<QPDF_Bool>(std::get<QPDF_Bool>(obj->value).val);
    case ::ot_integer:
        return QPDFObject::create<QPDF_Integer>(std::get<QPDF_Integer>(obj->value).val);
    case ::ot_real:
        return QPDFObject::create<QPDF_Real>(std::get<QPDF_Real>(obj->value).val);
    case ::ot_string:
        return QPDFObject::create<QPDF_String>(std::get<QPDF_String>(obj->value).val);
    case ::ot_name:
        return QPDFObject::create<QPDF_Name>(std::get<QPDF_Name>(obj->value).name);
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Array>(a);
            } else {
                QTC::TC("qpdf", "QPDF_Array copy", a.sp ? 0 : 1);
                if (a.sp) {
                    QPDF_Array result;
                    result.sp = std::make_unique<QPDF_Array::Sparse>();
                    result.sp->size = a.sp->size;
                    for (auto const& [idx, oh]: a.sp->elements) {
                        result.sp->elements[idx] = oh.indirect() ? oh : oh.copy();
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result));
                } else {
                    std::vector<QPDFObjectHandle> result;
                    result.reserve(a.elements.size());
                    for (auto const& element: a.elements) {
                        result.emplace_back(
                            element ? (element.indirect() ? element : element.copy()) : element);
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result), false);
                }
            }
        }
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Dictionary>(d.items);
            } else {
                std::map<std::string, QPDFObjectHandle> new_items;
                for (auto const& [key, val]: d.items) {
                    new_items[key] = val.indirect() ? val : val.copy();
                }
                return QPDFObject::create<QPDF_Dictionary>(new_items);
            }
        }
    case ::ot_stream:
        QTC::TC("qpdf", "QPDF_Stream ERR shallow copy stream");
        throw std::runtime_error("stream objects cannot be cloned");
        return {}; // does not return
    case ::ot_operator:
        return QPDFObject::create<QPDF_Operator>(std::get<QPDF_Operator>(obj->value).val);
    case ::ot_inlineimage:
        return QPDFObject::create<QPDF_InlineImage>(std::get<QPDF_InlineImage>(obj->value).val);
    case ::ot_unresolved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a reserved object");
        return {}; // does not return
    case ::ot_destroyed:
        throw std::logic_error("attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
        return {}; // does not return
    case ::ot_reference:
        return obj->qpdf->getObject(obj->og).getObj();
    }
    return {}; // unreachable
}